

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServer::WriteSignal(cmServer *this,string *name,Value *data)

{
  bool bVar1;
  Value *pVVar2;
  Value obj;
  Value local_e0;
  Value local_b8;
  Value local_90;
  Value local_68;
  Value local_40;
  
  bVar1 = Json::Value::isObject(data);
  if (bVar1) {
    Json::Value::Value(&local_e0,data);
    Json::Value::Value(&local_40,&kSIGNAL_TYPE_abi_cxx11_);
    pVVar2 = Json::Value::operator[](&local_e0,&kTYPE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_40);
    Json::Value::~Value(&local_40);
    Json::Value::Value(&local_68,"");
    pVVar2 = Json::Value::operator[](&local_e0,&kREPLY_TO_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_68);
    Json::Value::~Value(&local_68);
    Json::Value::Value(&local_90,"");
    pVVar2 = Json::Value::operator[](&local_e0,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_90);
    Json::Value::~Value(&local_90);
    Json::Value::Value(&local_b8,name);
    pVVar2 = Json::Value::operator[](&local_e0,&kNAME_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_b8);
    Json::Value::~Value(&local_b8);
    WriteJsonObject(this,&local_e0,(DebugInfo *)0x0);
    Json::Value::~Value(&local_e0);
    return;
  }
  __assert_fail("data.isObject()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServer.cxx"
                ,0x171,"void cmServer::WriteSignal(const std::string &, const Json::Value &) const")
  ;
}

Assistant:

void cmServer::WriteSignal(const std::string& name,
                           const Json::Value& data) const
{
  assert(data.isObject());
  Json::Value obj = data;
  obj[kTYPE_KEY] = kSIGNAL_TYPE;
  obj[kREPLY_TO_KEY] = "";
  obj[kCOOKIE_KEY] = "";
  obj[kNAME_KEY] = name;

  WriteJsonObject(obj, nullptr);
}